

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptTextureBufferType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  TQualifier *pTVar2;
  TTypeList *userDef;
  pool_allocator<char> local_188;
  TString local_180;
  undefined1 local_158 [8];
  TType blockType;
  undefined1 local_b8 [8];
  TType templateType;
  TType *type_local;
  HlslGrammar *this_local;
  
  templateType.spirvType = (TSpirvType *)type;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokTextureBuffer);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      TType::TType((TType *)local_b8,EbtVoid,EvqTemporary,1,0,0,false);
      bVar1 = acceptType(this,(TType *)local_b8);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          pTVar2 = TType::getQualifier((TType *)local_b8);
          *(ulong *)&pTVar2->field_0x8 = *(ulong *)&pTVar2->field_0x8 & 0xffffffffffffff80 | 6;
          pTVar2 = TType::getQualifier((TType *)local_b8);
          *(ulong *)&pTVar2->field_0x8 =
               *(ulong *)&pTVar2->field_0x8 & 0xffff7fffffffffff | 0x800000000000;
          userDef = TType::getWritableStruct((TType *)local_b8);
          pool_allocator<char>::pool_allocator(&local_188);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_180,"",&local_188);
          pTVar2 = TType::getQualifier((TType *)local_b8);
          TType::TType((TType *)local_158,userDef,&local_180,pTVar2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_180);
          pTVar2 = TType::getQualifier((TType *)local_158);
          *(ulong *)&pTVar2->field_0x8 = *(ulong *)&pTVar2->field_0x8 & 0xffffffffffffff80 | 6;
          pTVar2 = TType::getQualifier((TType *)local_158);
          *(ulong *)&pTVar2->field_0x8 =
               *(ulong *)&pTVar2->field_0x8 & 0xffff7fffffffffff | 0x800000000000;
          TType::shallowCopy((TType *)templateType.spirvType,(TType *)local_158);
          this_local._7_1_ = true;
          blockType.spirvType._4_4_ = 1;
          TType::~TType((TType *)local_158);
        }
        else {
          expected(this,"right angle bracket");
          this_local._7_1_ = false;
          blockType.spirvType._4_4_ = 1;
        }
      }
      else {
        expected(this,"type");
        this_local._7_1_ = false;
        blockType.spirvType._4_4_ = 1;
      }
      TType::~TType((TType *)local_b8);
    }
    else {
      expected(this,"left angle bracket");
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptTextureBufferType(TType& type)
{
    if (! acceptTokenClass(EHTokTextureBuffer))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        expected("left angle bracket");
        return false;
    }
    
    TType templateType;
    if (! acceptType(templateType)) {
        expected("type");
        return false;
    }

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    templateType.getQualifier().storage = EvqBuffer;
    templateType.getQualifier().readonly = true;

    TType blockType(templateType.getWritableStruct(), "", templateType.getQualifier());

    blockType.getQualifier().storage = EvqBuffer;
    blockType.getQualifier().readonly = true;

    type.shallowCopy(blockType);

    return true;
}